

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int scanNumber(char **ptr)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = *ptr;
  iVar1 = 0;
  while( true ) {
    if (9 < (byte)(*pcVar2 - 0x30U)) break;
    iVar1 = (uint)(byte)(*pcVar2 - 0x30U) + iVar1 * 10;
    pcVar2 = pcVar2 + 1;
  }
  *ptr = pcVar2;
  return iVar1;
}

Assistant:

static int scanNumber(char **ptr) {
    int ret = 0;
    char *cur;

    cur = *ptr;
    while ((*cur >= '0') && (*cur <= '9')) {
	ret = ret * 10 + (*cur - '0');
	cur++;
    }
    *ptr = cur;
    return(ret);
}